

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O2

int __thiscall CmdLineArgsParser::ParseInteger(CmdLineArgsParser *this)

{
  code *pcVar1;
  bool bVar2;
  WCHAR WVar3;
  LPWSTR pWVar4;
  undefined4 *puVar5;
  undefined8 *puVar6;
  char16_t *pcVar7;
  uint uVar8;
  WCHAR *pWVar9;
  int iVar10;
  int iVar11;
  undefined8 local_38;
  
  pWVar4 = this->pszCurrentArg;
  WVar3 = *pWVar4;
  if (WVar3 == L'-') {
    this->pszCurrentArg = pWVar4 + 1;
    WVar3 = pWVar4[1];
    uVar8 = 0xffffffff;
    pWVar4 = pWVar4 + 1;
  }
  else {
    uVar8 = 1;
  }
  if ((ushort)(WVar3 + L'￐') < 10) {
    iVar10 = 10;
    iVar11 = 0;
    local_38 = (ulong)uVar8;
    pWVar9 = pWVar4;
    if (WVar3 == L'0') {
      this->pszCurrentArg = pWVar4 + 1;
      pWVar9 = pWVar4 + 1;
      if (pWVar4[1] == L'x') {
        this->pszCurrentArg = pWVar4 + 2;
        iVar10 = 0x10;
        local_38 = CONCAT44(1,uVar8);
        pWVar9 = pWVar4 + 2;
      }
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    while( true ) {
      WVar3 = *pWVar9;
      if (9 < (ushort)(WVar3 + L'￐')) {
        if ((local_38._4_1_ == '\0') || (bVar2 = IsHexDigit(this), !bVar2)) {
          return iVar11 * (int)local_38;
        }
        pWVar9 = this->pszCurrentArg;
        WVar3 = *pWVar9;
        if (0x66 < (ushort)WVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/CmdParser.cpp"
                             ,0xd3,"(currentDigit < 16)","currentDigit < 16");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar5 = 0;
          pWVar9 = this->pszCurrentArg;
          WVar3 = *pWVar9;
        }
      }
      iVar11 = iVar11 * iVar10 + (uint)(ushort)WVar3 + -0x30;
      if (iVar11 < 0) break;
      pWVar9 = pWVar9 + 1;
      this->pszCurrentArg = pWVar9;
    }
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar7 = L"Integer too large to parse";
  }
  else {
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar7 = L"Integer Expected";
  }
  *puVar6 = pcVar7;
  __cxa_throw(puVar6,&Exception::typeinfo,0);
}

Assistant:

int
CmdLineArgsParser::ParseInteger()
{
    int result  = 0;
    int sign    = 1;

    if('-' == CurChar())
    {
        sign = -1;
        NextChar();
    }
    if(!IsDigit())
    {
        throw Exception(_u("Integer Expected"));
    }

    int base = 10;

    if ('0' == CurChar())
    {
        NextChar();
        if (CurChar() == 'x')
        {
            NextChar();
            base = 16;
        }
        // Should the else case be parse as octal?
    }

    while(IsDigit() || (base == 16 && IsHexDigit()))
    {
        int currentDigit = (int)(CurChar() - '0');
        if (currentDigit > 9)
        {
            Assert(base == 16);
            if (CurChar() < 'F')
            {
                currentDigit = 10 + (int)(CurChar() - 'A');
            }
            else
            {
                currentDigit = 10 + (int)(CurChar() - 'a');
            }

            Assert(currentDigit < 16);
        }

        result = result * base + (int)(CurChar() - '0');
        if(result < 0)
        {
            // overflow or underflow in case sign = -1
            throw Exception(_u("Integer too large to parse"));
        }

        NextChar();
    }

    return result * sign;
}